

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_gen.c
# Opt level: O1

iogen_oprnd *
gen_size_conversion(iogen_oprnd *__return_storage_ptr__,dill_stream c,iogen_oprnd src_oprnd,int size
                   )

{
  dill_mach_end p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  jmp_table pjVar5;
  jmp_table __ptr;
  dill_mach_init_routine __dest;
  int iVar6;
  uint extraout_EDX;
  iogen_oprnd *piVar7;
  int iVar8;
  dill_reg *pdVar9;
  dill_stream pdVar10;
  dill_reg *pdVar11;
  int local_2c;
  
  __return_storage_ptr__->vc_reg = (int)src_oprnd._32_8_;
  __return_storage_ptr__->vc_reg2 = (int)((ulong)src_oprnd._32_8_ >> 0x20);
  uVar2 = src_oprnd._0_8_;
  uVar3 = src_oprnd._8_8_;
  __return_storage_ptr__->offset = src_oprnd.offset;
  __return_storage_ptr__->aligned = src_oprnd.aligned;
  __return_storage_ptr__->byte_swap = src_oprnd.byte_swap;
  __return_storage_ptr__->address = (int)uVar2;
  __return_storage_ptr__->data_type = (int)((ulong)uVar2 >> 0x20);
  *(undefined8 *)&__return_storage_ptr__->size = uVar3;
  __return_storage_ptr__->size = size;
  if (boolean_type < src_oprnd.data_type) {
    return __return_storage_ptr__;
  }
  pdVar10 = c;
  if ((0xd4U >> (src_oprnd.data_type & 0x1f) & 1) != 0) {
    switch(size) {
    case 1:
      pdVar11 = &__return_storage_ptr__->vc_reg;
      pdVar9 = pdVar11;
      iVar4 = ffs_getreg(c,pdVar11,1,1);
      if (iVar4 == 0) {
LAB_00116124:
        gen_size_conversion_cold_8();
LAB_00116129:
        gen_size_conversion_cold_7();
LAB_0011612e:
        gen_size_conversion_cold_4();
LAB_00116133:
        gen_size_conversion_cold_2();
        goto LAB_00116138;
      }
      if (src_oprnd.size == 8) {
LAB_00115ebe:
        pjVar5 = c->j;
        iVar4 = __return_storage_ptr__->vc_reg;
        iVar8 = 6;
        goto LAB_00115ed1;
      }
      if (src_oprnd.size == 4) {
        pjVar5 = c->j;
        iVar4 = *pdVar11;
        iVar8 = 4;
      }
      else {
LAB_00115c14:
        if (src_oprnd.size != 2) {
          return __return_storage_ptr__;
        }
        pjVar5 = c->j;
        iVar4 = __return_storage_ptr__->vc_reg;
        iVar8 = 2;
      }
      (*pjVar5->convert)(c,iVar8,6,iVar4,src_oprnd.vc_reg);
      pjVar5 = c->j;
      iVar4 = __return_storage_ptr__->vc_reg;
      iVar8 = 6;
      iVar6 = 0;
      break;
    case 2:
      pdVar9 = &__return_storage_ptr__->vc_reg;
      iVar4 = ffs_getreg(c,pdVar9,3,1);
      if (iVar4 == 0) goto LAB_00116129;
      if (src_oprnd.size == 8) goto LAB_00115fa0;
      if (src_oprnd.size != 4) {
        if (src_oprnd.size != 1) {
          return __return_storage_ptr__;
        }
        pdVar9 = &local_2c;
        pdVar10 = c;
        iVar4 = ffs_getreg(c,pdVar9,6,1);
        if (iVar4 != 0) {
LAB_00115dbd:
          (*c->j->convert)(c,0,6,local_2c,src_oprnd.vc_reg);
          (*c->j->convert)(c,6,2,__return_storage_ptr__->vc_reg,local_2c);
          ffs_putreg(c,local_2c,6);
          return __return_storage_ptr__;
        }
        goto LAB_00116151;
      }
LAB_00115f8b:
      pjVar5 = c->j;
      iVar4 = __return_storage_ptr__->vc_reg;
      iVar8 = 4;
LAB_00115fb3:
      iVar6 = 2;
      break;
    default:
      goto switchD_00115bda_caseD_3;
    case 4:
      pdVar11 = &__return_storage_ptr__->vc_reg;
      pdVar9 = pdVar11;
      iVar4 = ffs_getreg(c,pdVar11,5,1);
      if (iVar4 == 0) {
        gen_size_conversion_cold_5();
        goto LAB_00116124;
      }
      if (src_oprnd.size == 8) {
        pjVar5 = c->j;
        iVar4 = *pdVar11;
        iVar8 = 6;
      }
      else if (src_oprnd.size == 2) {
        pjVar5 = c->j;
        iVar4 = *pdVar11;
        iVar8 = 2;
      }
      else {
        if (src_oprnd.size != 1) {
          return __return_storage_ptr__;
        }
        pjVar5 = c->j;
        iVar4 = *pdVar11;
        iVar8 = 0;
      }
      iVar6 = 5;
      break;
    case 8:
      pdVar11 = &__return_storage_ptr__->vc_reg;
      pdVar9 = pdVar11;
      iVar4 = ffs_getreg(c,pdVar11,7,1);
      if (iVar4 == 0) goto LAB_0011612e;
      if (src_oprnd.size == 4) {
        pjVar5 = c->j;
        iVar4 = *pdVar11;
        iVar8 = 5;
      }
      else if (src_oprnd.size == 2) {
        pjVar5 = c->j;
        iVar4 = *pdVar11;
        iVar8 = 3;
      }
      else {
        if (src_oprnd.size != 1) {
          return __return_storage_ptr__;
        }
        pjVar5 = c->j;
        iVar4 = *pdVar11;
        iVar8 = 1;
      }
      iVar6 = 7;
    }
LAB_00116109:
    (*pjVar5->convert)(c,iVar8,iVar6,iVar4,src_oprnd.vc_reg);
switchD_00115bda_caseD_3:
    return __return_storage_ptr__;
  }
  if (src_oprnd.data_type == integer_type) {
    switch(size) {
    case 1:
      pdVar11 = &__return_storage_ptr__->vc_reg;
      pdVar9 = pdVar11;
      iVar4 = ffs_getreg(c,pdVar11,0,1);
      if (iVar4 != 0) {
        if (src_oprnd.size == 8) goto LAB_00115ebe;
        if (src_oprnd.size != 4) goto LAB_00115c14;
        pjVar5 = c->j;
        iVar4 = *pdVar11;
        iVar8 = 4;
LAB_00115ed1:
        iVar6 = 0;
        goto LAB_00116109;
      }
      goto LAB_0011613d;
    case 2:
      pdVar9 = &__return_storage_ptr__->vc_reg;
      iVar4 = ffs_getreg(c,pdVar9,2,1);
      if (iVar4 != 0) {
        if (src_oprnd.size != 8) {
          if (src_oprnd.size != 4) {
            if (src_oprnd.size != 1) {
              return __return_storage_ptr__;
            }
            iVar4 = ffs_getreg(c,&local_2c,6,1);
            if (iVar4 != 0) goto LAB_00115dbd;
            gen_size_conversion_cold_11();
          }
          goto LAB_00115f8b;
        }
LAB_00115fa0:
        pjVar5 = c->j;
        iVar4 = __return_storage_ptr__->vc_reg;
        iVar8 = 6;
        goto LAB_00115fb3;
      }
      goto LAB_00116147;
    default:
      goto switchD_00115bda_caseD_3;
    case 4:
      pdVar11 = &__return_storage_ptr__->vc_reg;
      pdVar9 = pdVar11;
      iVar4 = ffs_getreg(c,pdVar11,4,1);
      if (iVar4 != 0) {
        if (src_oprnd.size == 8) {
          pjVar5 = c->j;
          iVar4 = *pdVar11;
          iVar8 = 6;
        }
        else if (src_oprnd.size == 2) {
          pjVar5 = c->j;
          iVar4 = *pdVar11;
          iVar8 = 2;
        }
        else {
          if (src_oprnd.size != 1) {
            return __return_storage_ptr__;
          }
          pjVar5 = c->j;
          iVar4 = *pdVar11;
          iVar8 = 0;
        }
        iVar6 = 4;
        goto LAB_00116109;
      }
      goto LAB_00116142;
    case 8:
      pdVar11 = &__return_storage_ptr__->vc_reg;
      pdVar9 = pdVar11;
      iVar4 = ffs_getreg(c,pdVar11,6,1);
      if (iVar4 != 0) {
        if (src_oprnd.size == 4) {
          pjVar5 = c->j;
          iVar4 = *pdVar11;
          iVar8 = 4;
        }
        else if (src_oprnd.size == 2) {
          pjVar5 = c->j;
          iVar4 = *pdVar11;
          iVar8 = 2;
        }
        else {
          if (src_oprnd.size != 1) {
            return __return_storage_ptr__;
          }
          pjVar5 = c->j;
          iVar4 = *pdVar11;
          iVar8 = 0;
        }
        iVar6 = 6;
        goto LAB_00116109;
      }
    }
  }
  else {
    if (src_oprnd.data_type != float_type) {
      return __return_storage_ptr__;
    }
    pdVar11 = &__return_storage_ptr__->vc_reg;
    pdVar9 = pdVar11;
    if (size == 8) {
      iVar4 = ffs_getreg(c,pdVar11,10,1);
      if (iVar4 == 0) {
        gen_size_conversion_cold_1();
        goto LAB_00115e7e;
      }
LAB_00115e95:
      if (src_oprnd.size != 4) {
        return __return_storage_ptr__;
      }
      pjVar5 = c->j;
      iVar4 = *pdVar11;
      iVar8 = 9;
      iVar6 = 10;
      goto LAB_00116109;
    }
    if (size == 4) {
      iVar4 = ffs_getreg(c,pdVar11,9,1);
      if (iVar4 != 0) {
        if (src_oprnd.size != 8) {
          return __return_storage_ptr__;
        }
        pjVar5 = c->j;
        iVar4 = *pdVar11;
        iVar8 = 10;
        iVar6 = 9;
        goto LAB_00116109;
      }
      goto LAB_00116133;
    }
LAB_00115e7e:
    iVar4 = ffs_getreg(pdVar10,pdVar9,10,1);
    if (iVar4 != 0) goto LAB_00115e95;
LAB_00116138:
    gen_size_conversion_cold_3();
LAB_0011613d:
    gen_size_conversion_cold_13();
LAB_00116142:
    gen_size_conversion_cold_10();
LAB_00116147:
    gen_size_conversion_cold_12();
  }
  gen_size_conversion_cold_9();
LAB_00116151:
  gen_size_conversion_cold_6();
  pjVar5 = pdVar10->j;
  __ptr = (jmp_table)ffs_malloc(0x18);
  piVar7 = (iogen_oprnd *)0x1;
  if (__ptr != (jmp_table)0x0) {
    __dest = (dill_mach_init_routine)ffs_malloc((ulong)extraout_EDX);
    __ptr->init = __dest;
    if (__dest == (dill_mach_init_routine)0x0) {
      free(__ptr);
    }
    else {
      memcpy(__dest,pdVar9,(ulong)extraout_EDX);
      __ptr->proc_start = (dill_mach_proc_start)0x0;
      __ptr->end = (dill_mach_end)0x0;
      if (pjVar5 == (jmp_table)0x0) {
        __ptr->proc_start = (dill_mach_proc_start)__ptr;
        __ptr->end = (dill_mach_end)__ptr;
        pdVar10->j = __ptr;
      }
      else {
        __ptr->proc_start = (dill_mach_proc_start)pjVar5;
        p_Var1 = pjVar5->end;
        *(jmp_table *)(p_Var1 + 8) = __ptr;
        __ptr->end = p_Var1;
        pjVar5->end = (dill_mach_end)__ptr;
      }
      piVar7 = (iogen_oprnd *)0x0;
    }
  }
  return piVar7;
}

Assistant:

iogen_oprnd
gen_size_conversion(dill_stream c, iogen_oprnd src_oprnd, int size)
{
    iogen_oprnd result_oprnd = src_oprnd;
    dill_reg at;  /* temporary */
    result_oprnd.size = size;
    switch (src_oprnd.data_type) {
    case integer_type:
	switch (size) {
	case 1:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_C, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 2:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_S, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		if (!ffs_getreg(c, &at, DILL_L, DILL_TEMP))
		    gen_fatal("gen type convert2 out of registers \n");
		dill_cvc2l(c, at, src_oprnd.vc_reg);
		dill_cvl2s(c, result_oprnd.vc_reg, at);
		ffs_putreg(c, at, DILL_L);
		break;
	    case 4:
		dill_cvi2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 4:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_I, DILL_TEMP))
		gen_fatal("gen size convert out of registers E\n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2i(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2i(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2i(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 8:
#if SIZEOF_SIZE_T == 8
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_L, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#else
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_L, DILL_TEMP) ||
		(!ffs_getreg(c, &result_oprnd.vc_reg2, DILL_L, DILL_TEMP)))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg2)));
	    dill_setl(c, result_oprnd.vc_reg2, 0);
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#endif
	}
	break;
    case boolean_type:
    case enumeration_type:
    case unsigned_type:
    case char_type:
	switch (size) {
	case 1:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_UC, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 2:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_US, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		if (!ffs_getreg(c, &at, DILL_L, DILL_TEMP))
		    gen_fatal("gen type convert2 out of registers \n");
		dill_cvc2l(c, at, src_oprnd.vc_reg);
		dill_cvl2s(c, result_oprnd.vc_reg, at);
		ffs_putreg(c, at, DILL_L);
		break;
	    case 4:
		dill_cvi2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 4:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_U, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2u(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2u(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2u(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 8:
#if SIZEOF_SIZE_T == 8
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_UL, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvuc2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvus2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvu2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#else
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_UL, DILL_TEMP) ||
		!ffs_getreg(c, &result_oprnd.vc_reg2, DILL_UL, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg2)));
	    dill_setl(c, result_oprnd.vc_reg2, 0);
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#endif
	}
	break;
    case float_type:
	switch (size) {
	case SIZEOF_FLOAT:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_F, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case SIZEOF_FLOAT:
		assert(FALSE);
		break;
	    case SIZEOF_DOUBLE:
		dill_cvd2f(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    default:
		assert(FALSE);
	    }
	    break;
	case SIZEOF_DOUBLE:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_D, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case SIZEOF_DOUBLE:
		assert(FALSE);
		break;
	    case SIZEOF_FLOAT:
		dill_cvf2d(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    default:
		assert(FALSE);
	    }
	    break;
	default:
	    /* really should fail */
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_D, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case SIZEOF_DOUBLE:
/*		assert(FALSE);*/
		break;
	    case SIZEOF_FLOAT:
		dill_cvf2d(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    default:
		assert(FALSE);
	    }
	    break;
	    
	}
	break;
    case unknown_type:
    default:
	assert(FALSE);
	break;
    }
    return result_oprnd;
}